

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O0

int cimg_library::cimg::fwrite<unsigned_char>(uchar *ptr,uint nmemb,FILE *stream)

{
  int iVar1;
  CImgArgumentException *this;
  char *pcVar2;
  size_t sVar3;
  FILE *in_RDX;
  uint in_ESI;
  long in_RDI;
  char *pcVar4;
  uint l_al_write;
  uint l_to_write;
  uint al_write;
  uint to_write;
  unsigned_long wlimit;
  unsigned_long wlimitT;
  bool local_71;
  size_t local_70;
  uint local_48;
  uint local_44;
  uint local_4;
  
  if ((in_RDI != 0) && (in_RDX != (FILE *)0x0)) {
    if (in_ESI == 0) {
      local_4 = 0;
    }
    else {
      local_48 = 0;
      local_44 = in_ESI;
      do {
        if (local_44 < 0x3f00000) {
          local_70 = (size_t)local_44;
        }
        else {
          local_70 = 0x3f00000;
        }
        sVar3 = fwrite((void *)(in_RDI + (ulong)local_48),1,local_70,in_RDX);
        iVar1 = (int)sVar3;
        local_48 = iVar1 + local_48;
        local_44 = local_44 - iVar1;
        local_71 = (int)local_70 == iVar1 && local_44 != 0;
      } while (local_71);
      local_4 = local_48;
      if (local_44 != 0) {
        warn("cimg::fwrite() : Only %u/%u elements could be written in file.",(ulong)local_48,
             (ulong)in_ESI);
      }
    }
    return local_4;
  }
  this = (CImgArgumentException *)__cxa_allocate_exception(0x4008);
  pcVar2 = type<unsigned_char>::string();
  pcVar4 = "";
  if (1 < in_ESI) {
    pcVar4 = "s";
  }
  CImgArgumentException::CImgArgumentException
            (this,"cimg::fwrite() : Invalid writing request of %u %s%s from buffer %p to file %p.",
             (ulong)in_ESI,pcVar2,pcVar4,in_RDI,in_RDX);
  __cxa_throw(this,&CImgArgumentException::typeinfo,CImgArgumentException::~CImgArgumentException);
}

Assistant:

inline int fwrite(const T *ptr, const unsigned int nmemb, std::FILE *stream) {
      if (!ptr || !stream)
        throw CImgArgumentException("cimg::fwrite() : Invalid writing request of %u %s%s from buffer %p to file %p.",
                                    nmemb,cimg::type<T>::string(),nmemb>1?"s":"",ptr,stream);
      if (nmemb<=0) return 0;
      const unsigned long wlimitT = 63*1024*1024, wlimit = wlimitT/sizeof(T);
      unsigned int to_write = nmemb, al_write = 0, l_to_write = 0, l_al_write = 0;
      do {
        l_to_write = (to_write*sizeof(T))<wlimitT?to_write:wlimit;
        l_al_write = (unsigned int)std::fwrite((void*)(ptr+al_write),sizeof(T),l_to_write,stream);
        al_write+=l_al_write;
        to_write-=l_al_write;
      } while (l_to_write==l_al_write && to_write>0);
      if (to_write>0)
        warn("cimg::fwrite() : Only %u/%u elements could be written in file.",
             al_write,nmemb);
      return al_write;
    }